

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

string * __thiscall Edge::GetUnescapedRspfile_abi_cxx11_(string *__return_storage_ptr__,Edge *this)

{
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  EdgeEnv env;
  Edge *this_local;
  
  env._40_8_ = this;
  EdgeEnv::EdgeEnv((EdgeEnv *)local_48,this,kDoNotEscape);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"rspfile",&local_69);
  EdgeEnv::LookupVariable(__return_storage_ptr__,(EdgeEnv *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  EdgeEnv::~EdgeEnv((EdgeEnv *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Edge::GetUnescapedRspfile() const {
  EdgeEnv env(this, EdgeEnv::kDoNotEscape);
  return env.LookupVariable("rspfile");
}